

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
libcellml::Validator::ValidatorImpl::validateMathMLElements
          (ValidatorImpl *this,XmlNodePtr *node,ComponentPtr *component)

{
  XmlNodePtr local_50 [2];
  XmlNodePtr local_30;
  ComponentPtr *local_20;
  ComponentPtr *component_local;
  XmlNodePtr *node_local;
  ValidatorImpl *this_local;
  
  local_20 = component;
  component_local = (ComponentPtr *)node;
  node_local = (XmlNodePtr *)this;
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstChild((XmlNode *)&local_30);
  validateMathMLElement(this,&local_30,local_20);
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_30);
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             component_local);
  XmlNode::next((XmlNode *)local_50);
  validateMathMLElement(this,local_50,local_20);
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr(local_50);
  return;
}

Assistant:

void Validator::ValidatorImpl::validateMathMLElements(const XmlNodePtr &node, const ComponentPtr &component)
{
    validateMathMLElement(node->firstChild(), component);
    validateMathMLElement(node->next(), component);
}